

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O3

MPP_RET dec_buf_mgr_init(DecBufMgr *mgr)

{
  MPP_RET MVar1;
  DecBufMgr pvVar2;
  
  if (mgr != (DecBufMgr *)0x0) {
    pvVar2 = (DecBufMgr)mpp_osal_calloc("dec_buf_mgr_init",0x20);
    MVar1 = MPP_OK;
    if (pvVar2 == (DecBufMgr)0x0) {
      _mpp_log_l(2,"mpi_dec_utils","failed to create decoder buffer manager\n","dec_buf_mgr_init");
      MVar1 = MPP_NOK;
    }
    *mgr = pvVar2;
    return MVar1;
  }
  return MPP_NOK;
}

Assistant:

MPP_RET dec_buf_mgr_init(DecBufMgr *mgr)
{
    DecBufMgrImpl *impl = NULL;
    MPP_RET ret = MPP_NOK;

    if (mgr) {
        impl = mpp_calloc(DecBufMgrImpl, 1);
        if (impl) {
            ret = MPP_OK;
        } else {
            mpp_err_f("failed to create decoder buffer manager\n");
        }

        *mgr = impl;
    }

    return ret;
}